

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.cpp
# Opt level: O1

char * findlocal(lua_State *L,CallInfo *ci,int n)

{
  GCObject *pGVar1;
  int pc;
  char *pcVar2;
  StkId *ppTVar3;
  Proto *f;
  
  if ((ci->func->tt == 6) && (pGVar1 = (ci->func->value).gc, (pGVar1->h).flags == '\0')) {
    f = (Proto *)(pGVar1->h).node;
  }
  else {
    f = (Proto *)0x0;
  }
  if (f != (Proto *)0x0) {
    pc = currentpc(L,ci);
    pcVar2 = luaF_getlocalname(f,n,pc);
    if (pcVar2 != (char *)0x0) {
      return pcVar2;
    }
  }
  ppTVar3 = &ci[1].func;
  if (L->ci == ci) {
    ppTVar3 = &L->top;
  }
  pcVar2 = "(*temporary)";
  if ((long)*ppTVar3 - (long)ci->base >> 4 < (long)n) {
    pcVar2 = (char *)0x0;
  }
  if (n < 1) {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

static const char *findlocal (lua_State *L, CallInfo *ci, int n) {
  const char *name;
  Proto *fp = getluaproto(ci);
  if (fp && (name = luaF_getlocalname(fp, n, currentpc(L, ci))) != NULL)
    return name;  /* is a local variable in a Lua function */
  else {
    StkId limit = (ci == L->ci) ? L->top : (ci+1)->func;
    if (limit - ci->base >= n && n > 0)  /* is 'n' inside 'ci' stack? */
      return "(*temporary)";
    else
      return NULL;
  }
}